

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O2

Object3D * __thiscall SceneParser::parseObject(SceneParser *this,char *token)

{
  int iVar1;
  Transform *pTVar2;
  Group *pGVar3;
  Sphere *pSVar4;
  Torus *pTVar5;
  Plane *pPVar6;
  Area *pAVar7;
  Object3D *pOVar8;
  Mesh *pMVar9;
  
  iVar1 = strcmp(token,"Group");
  if (iVar1 == 0) {
    pGVar3 = parseGroup(this);
    return &pGVar3->super_Object3D;
  }
  iVar1 = strcmp(token,"Sphere");
  if (iVar1 == 0) {
    pSVar4 = parseSphere(this);
    return &pSVar4->super_Object3D;
  }
  iVar1 = strcmp(token,"Torus");
  if (iVar1 == 0) {
    pTVar5 = parseTorus(this);
    return &pTVar5->super_Object3D;
  }
  iVar1 = strcmp(token,"Plane");
  if (iVar1 == 0) {
    pPVar6 = parsePlane(this);
    return &pPVar6->super_Object3D;
  }
  iVar1 = strcmp(token,"Area");
  if (iVar1 == 0) {
    pAVar7 = parseArea(this);
    return &pAVar7->super_Object3D;
  }
  iVar1 = strcmp(token,"Triangle");
  if (iVar1 == 0) {
    pOVar8 = &parseTriangle(this)->super_Object3D;
    return pOVar8;
  }
  iVar1 = strcmp(token,"TriangleMesh");
  if (iVar1 == 0) {
    pMVar9 = parseTriangleMesh(this);
    return &pMVar9->super_Object3D;
  }
  iVar1 = strcmp(token,"Transform");
  if (iVar1 == 0) {
    pTVar2 = parseTransform(this);
    return &pTVar2->super_Object3D;
  }
  printf("Unknown token in parseObject: \'%s\'\n",token);
  exit(0);
}

Assistant:

Object3D *
SceneParser::parseObject(char token[MAX_PARSER_TOKEN_LENGTH]) {
    Object3D *answer = nullptr;
    if (!strcmp(token, "Group")) {
        answer = (Object3D *) parseGroup();
    } else if (!strcmp(token, "Sphere")) {
        answer = (Object3D *) parseSphere();
    } else if (!strcmp(token, "Torus")) {
        answer = (Object3D *) parseTorus();
    } else if (!strcmp(token, "Plane")) {
        answer = (Object3D *) parsePlane();
    } else if (!strcmp(token, "Area")) {
        answer = (Object3D *) parseArea();
    } else if (!strcmp(token, "Triangle")) {
        answer = (Object3D *) parseTriangle();
    } else if (!strcmp(token, "TriangleMesh")) {
        answer = (Object3D *) parseTriangleMesh();
    } else if (!strcmp(token, "Transform")) {
        answer = (Object3D *) parseTransform();
    } else {
        printf("Unknown token in parseObject: '%s'\n", token);
        exit(0);
    }
    return answer;
}